

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Library::FunctionSignatureExists(Library *this,FunctionSignature *signature)

{
  FunctionSignature *pFVar1;
  __normal_iterator<const_Jinx::Impl::FunctionSignature_*,_std::vector<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>_>
  _Var2;
  
  std::mutex::lock(&this->m_propertyMutex);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<Jinx::Impl::FunctionSignature_const*,std::vector<Jinx::Impl::FunctionSignature,Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,4096ul,16ul>>>,__gnu_cxx::__ops::_Iter_equals_val<Jinx::Impl::FunctionSignature_const>>
                    ((this->m_functionList).
                     super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_functionList).
                     super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
                     ._M_impl.super__Vector_impl_data._M_finish,signature);
  pFVar1 = (this->m_functionList).
           super__Vector_base<Jinx::Impl::FunctionSignature,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignature,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return _Var2._M_current != pFVar1;
}

Assistant:

inline_t bool Library::FunctionSignatureExists(const FunctionSignature & signature) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = std::find(m_functionList.begin(), m_functionList.end(), signature);
		return itr == m_functionList.end() ? false : true;
	}